

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O0

void __thiscall soplex::DSVectorBase<double>::add(DSVectorBase<double> *this,int i,double *v)

{
  undefined8 in_RDX;
  int i_00;
  undefined4 in_ESI;
  DSVectorBase<double> *in_RDI;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  i_00 = (int)((ulong)in_RDX >> 0x20);
  makeMem(in_RDI,in_stack_ffffffffffffffdc);
  SVectorBase<double>::add
            ((SVectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),i_00,(double *)in_RDI
            );
  return;
}

Assistant:

void add(int i, const R& v)
   {
      makeMem(1);
      SVectorBase<R>::add(i, v);
   }